

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O3

void __thiscall
pbrt::
HashMap<int,_int,_std::hash<int>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_int>_>_>_>
::Insert(HashMap<int,_int,_std::hash<int>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_int>_>_>_>
         *this,int *key,int *value)

{
  size_t sVar1;
  optional<std::pair<int,_int>_> *poVar2;
  size_t sVar3;
  aligned_storage_t<sizeof(std::pair<int,_int>),_alignof(std::pair<int,_int>)> aVar4;
  
  sVar1 = FindOffset(this,key);
  poVar2 = (this->table).ptr;
  if ((poVar2[sVar1].set == false) &&
     (sVar3 = this->nStored + 1, this->nStored = sVar3, (this->table).nStored < sVar3 * 3)) {
    Grow(this);
    sVar1 = FindOffset(this,key);
    poVar2 = (this->table).ptr;
  }
  aVar4._4_4_ = *value;
  aVar4.__align = (anon_struct_4_0_00000001_for___align)*key;
  poVar2[sVar1].optionalValue = aVar4;
  poVar2[sVar1].set = true;
  return;
}

Assistant:

void Insert(const Key &key, const Value &value) {
        size_t offset = FindOffset(key);
        if (table[offset].has_value() == false) {
            // Grow hash table if it is too full
            if (3 * ++nStored > capacity()) {
                Grow();
                offset = FindOffset(key);
            }
        }
        table[offset] = std::make_pair(key, value);
    }